

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

CURLcode Curl_ssl_addsessionid(connectdata *conn,void *ssl_sessionid,size_t idsize,int sockindex)

{
  uint uVar1;
  Curl_easy *pCVar2;
  Curl_share *pCVar3;
  ulong uVar4;
  curl_ssl_session *pcVar5;
  _Bool _Var6;
  int iVar7;
  long lVar8;
  char *pcVar9;
  char *pcVar10;
  ulong uVar11;
  byte bVar12;
  curl_ssl_session *session;
  long *plVar13;
  long lVar14;
  long lVar15;
  
  pCVar2 = conn->data;
  session = (pCVar2->state).session;
  if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
    _Var6 = (conn->bits).proxy_ssl_connected[sockindex];
    lVar15 = 0x5c8;
    if (_Var6 != false) {
      lVar15 = 0x570;
    }
    lVar8 = 0x3d0;
    if (_Var6 != false) {
      lVar8 = 0x340;
    }
    bVar12 = _Var6 ^ 1;
  }
  else {
    lVar8 = 0x340;
    lVar15 = 0x570;
    bVar12 = 0;
  }
  lVar14 = session->age;
  pcVar9 = (*Curl_cstrdup)(*(char **)((conn->cnnct).socksreq + lVar8 + -0xc));
  if (pcVar9 == (char *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  uVar1 = *(uint *)&(conn->bits).field_0x4;
  if ((uVar1 & 8) == 0) {
    pcVar10 = (char *)0x0;
  }
  else {
    pcVar10 = (*Curl_cstrdup)((conn->conn_to_host).name);
    if (pcVar10 == (char *)0x0) {
      (*Curl_cfree)(pcVar9);
      return CURLE_OUT_OF_MEMORY;
    }
    uVar1 = *(uint *)&(conn->bits).field_0x4;
  }
  iVar7 = -1;
  if ((uVar1 & 0x10) != 0) {
    iVar7 = conn->conn_to_port;
  }
  pCVar3 = pCVar2->share;
  if ((pCVar3 == (Curl_share *)0x0) || ((pCVar3->specifier & 0x10) == 0)) {
    plVar13 = &(pCVar2->state).sessionage;
  }
  else {
    plVar13 = &pCVar3->sessionage;
  }
  uVar4 = (pCVar2->set).general_ssl.max_ssl_sessions;
  uVar11 = 1;
  if (uVar4 < 2) {
LAB_0014c5f5:
    if (uVar11 != uVar4) {
      session = (pCVar2->state).session + uVar11;
      goto LAB_0014c613;
    }
  }
  else {
    pcVar5 = (pCVar2->state).session;
    do {
      if (pcVar5[1].sessionid == (void *)0x0) goto LAB_0014c5f5;
      if (pcVar5[1].age < lVar14) {
        session = pcVar5 + 1;
        lVar14 = pcVar5[1].age;
      }
      uVar11 = uVar11 + 1;
      pcVar5 = pcVar5 + 1;
    } while (uVar4 != uVar11);
  }
  Curl_ssl_kill_session(session);
LAB_0014c613:
  session->sessionid = ssl_sessionid;
  session->idsize = idsize;
  session->age = *plVar13;
  (*Curl_cfree)(session->name);
  (*Curl_cfree)(session->conn_to_host);
  session->name = pcVar9;
  session->conn_to_host = pcVar10;
  session->conn_to_port = iVar7;
  if (bVar12 == 0) {
    iVar7 = conn->remote_port;
  }
  else {
    iVar7 = (int)conn->port;
  }
  session->remote_port = iVar7;
  session->scheme = conn->handler->scheme;
  _Var6 = Curl_clone_primary_ssl_config
                    ((ssl_primary_config *)((conn->cnnct).socksreq + lVar15 + -0xc),
                     &session->ssl_config);
  if (!_Var6) {
    session->sessionid = (void *)0x0;
    (*Curl_cfree)(pcVar9);
    (*Curl_cfree)(pcVar10);
    return CURLE_OUT_OF_MEMORY;
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_ssl_addsessionid(struct connectdata *conn,
                               void *ssl_sessionid,
                               size_t idsize,
                               int sockindex)
{
  size_t i;
  struct Curl_easy *data = conn->data; /* the mother of all structs */
  struct curl_ssl_session *store = &data->state.session[0];
  long oldest_age = data->state.session[0].age; /* zero if unused */
  char *clone_host;
  char *clone_conn_to_host;
  int conn_to_port;
  long *general_age;
  const bool isProxy = CONNECT_PROXY_SSL();
  struct ssl_primary_config * const ssl_config = isProxy ?
    &conn->proxy_ssl_config :
    &conn->ssl_config;

  DEBUGASSERT(SSL_SET_OPTION(primary.sessionid));

  clone_host = strdup(isProxy ? conn->http_proxy.host.name : conn->host.name);
  if(!clone_host)
    return CURLE_OUT_OF_MEMORY; /* bail out */

  if(conn->bits.conn_to_host) {
    clone_conn_to_host = strdup(conn->conn_to_host.name);
    if(!clone_conn_to_host) {
      free(clone_host);
      return CURLE_OUT_OF_MEMORY; /* bail out */
    }
  }
  else
    clone_conn_to_host = NULL;

  if(conn->bits.conn_to_port)
    conn_to_port = conn->conn_to_port;
  else
    conn_to_port = -1;

  /* Now we should add the session ID and the host name to the cache, (remove
     the oldest if necessary) */

  /* If using shared SSL session, lock! */
  if(SSLSESSION_SHARED(data)) {
    general_age = &data->share->sessionage;
  }
  else {
    general_age = &data->state.sessionage;
  }

  /* find an empty slot for us, or find the oldest */
  for(i = 1; (i < data->set.general_ssl.max_ssl_sessions) &&
        data->state.session[i].sessionid; i++) {
    if(data->state.session[i].age < oldest_age) {
      oldest_age = data->state.session[i].age;
      store = &data->state.session[i];
    }
  }
  if(i == data->set.general_ssl.max_ssl_sessions)
    /* cache is full, we must "kill" the oldest entry! */
    Curl_ssl_kill_session(store);
  else
    store = &data->state.session[i]; /* use this slot */

  /* now init the session struct wisely */
  store->sessionid = ssl_sessionid;
  store->idsize = idsize;
  store->age = *general_age;    /* set current age */
  /* free it if there's one already present */
  free(store->name);
  free(store->conn_to_host);
  store->name = clone_host;               /* clone host name */
  store->conn_to_host = clone_conn_to_host; /* clone connect to host name */
  store->conn_to_port = conn_to_port; /* connect to port number */
  /* port number */
  store->remote_port = isProxy ? (int)conn->port : conn->remote_port;
  store->scheme = conn->handler->scheme;

  if(!Curl_clone_primary_ssl_config(ssl_config, &store->ssl_config)) {
    store->sessionid = NULL; /* let caller free sessionid */
    free(clone_host);
    free(clone_conn_to_host);
    return CURLE_OUT_OF_MEMORY;
  }

  return CURLE_OK;
}